

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O0

size_t __thiscall
pstore::file::file_handle::read_buffer(file_handle *this,not_null<void_*> buffer,size_t nbytes)

{
  int __fd;
  long value;
  unsigned_long uVar1;
  void *__buf;
  int *piVar2;
  int local_78;
  undefined1 local_50 [44];
  int err;
  ssize_t r;
  size_t nbytes_local;
  file_handle *this_local;
  not_null<void_*> buffer_local;
  
  r = nbytes;
  nbytes_local = (size_t)this;
  this_local = (file_handle *)buffer.ptr_;
  value = std::numeric_limits<long>::max();
  uVar1 = unsigned_cast<long,unsigned_long,void>(value);
  if (uVar1 < nbytes) {
    raise<std::errc,char[12]>(invalid_argument,(char (*) [12])"read_buffer");
  }
  ensure_open(this);
  __fd = this->file_;
  __buf = gsl::not_null<void_*>::get((not_null<void_*> *)&this_local);
  register0x00000000 = read(__fd,__buf,r);
  if ((long)register0x00000000 < 0) {
    if (register0x00000000 == 0xffffffffffffffff) {
      piVar2 = __errno_location();
      local_78 = *piVar2;
    }
    else {
      local_78 = 0x16;
    }
    local_50._36_4_ = local_78;
    path_abi_cxx11_((file_handle *)local_50);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (local_78,"read failed",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  return register0x00000000;
}

Assistant:

std::size_t file_handle::read_buffer (gsl::not_null<void *> const buffer,
                                              std::size_t const nbytes) {
            if (nbytes > unsigned_cast (std::numeric_limits<ssize_t>::max ())) {
                raise (std::errc::invalid_argument, "read_buffer");
            }
            this->ensure_open ();

            ssize_t const r = ::read (file_, buffer.get (), nbytes);
            if (r < 0) {
                int const err = (r == -1) ? errno : EINVAL;
                raise_file_error (err, "read failed", this->path ());
            }
            return static_cast<std::size_t> (r);
        }